

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Gia_Man_t * Gia_MiniAigReduce(Mini_Aig_t *p,int *pEquivs)

{
  uint uVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Vec_Int_t *p_01;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint nObjsMax;
  
  iVar4 = p->nSize;
  nObjsMax = iVar4 / 2;
  p_00 = Gia_ManStart(nObjsMax);
  pcVar6 = (char *)malloc(8);
  builtin_strncpy(pcVar6,"MiniAig",8);
  p_00->pName = pcVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < nObjsMax - 1) {
    uVar11 = nObjsMax;
  }
  p_01->nSize = 0;
  p_01->nCap = uVar11;
  if (uVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)(int)uVar11 << 2);
  }
  p_01->pArray = piVar7;
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  if (3 < iVar4) {
    uVar12 = 2;
    if (2 < (int)nObjsMax) {
      uVar12 = (ulong)nObjsMax;
    }
    uVar10 = 1;
    do {
      iVar5 = (int)uVar10;
      iVar4 = Mini_AigNodeIsPi(p,iVar5);
      if (iVar4 == 0) {
        pGVar9 = (Gia_Man_t *)p;
        iVar4 = Mini_AigNodeIsPo(p,iVar5);
        if (iVar4 == 0) {
          pGVar9 = (Gia_Man_t *)p;
          iVar4 = Mini_AigNodeIsAnd(p,iVar5);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                          ,0x2bf,"Gia_Man_t *Gia_MiniAigReduce(Mini_Aig_t *, int *)");
          }
          iVar4 = Gia_ObjFromMiniFanin0Copy(pGVar9,p_01,p,iVar5);
          iVar5 = Gia_ObjFromMiniFanin1Copy(pGVar9,p_01,p,iVar5);
          uVar11 = Gia_ManHashAnd(p_00,iVar4,iVar5);
        }
        else {
          iVar4 = Gia_ObjFromMiniFanin0Copy(pGVar9,p_01,p,iVar5);
          uVar11 = Gia_ManAppendCo(p_00,iVar4);
        }
      }
      else {
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar2 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar2 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_007806a8:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_007806a8;
        uVar11 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      }
      uVar1 = pEquivs[uVar10];
      if (uVar1 != 0xffffffff) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (p_01->nSize <= (int)(uVar1 >> 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p_01->pArray[uVar1 >> 1] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar11 = p_01->pArray[uVar1 >> 1] ^ uVar1 & 1;
      }
      Vec_IntPush(p_01,uVar11);
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
  }
  Gia_ManHashStop(p_00);
  if (p_01->nSize != nObjsMax) {
    __assert_fail("Vec_IntSize(vCopies) == nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                  ,0x2c5,"Gia_Man_t *Gia_MiniAigReduce(Mini_Aig_t *, int *)");
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar9 = Gia_ManSeqCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_MiniAigReduce( Mini_Aig_t * p, int * pEquivs )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
            iGiaLit = Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        if ( pEquivs[i] != -1 )
            iGiaLit = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(pEquivs[i])), Abc_LitIsCompl(pEquivs[i]) );
        Vec_IntPush( vCopies, iGiaLit );
    }
    Gia_ManHashStop( pGia );
    assert( Vec_IntSize(vCopies) == nNodes );
    Vec_IntFree( vCopies );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    pGia = Gia_ManSeqCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}